

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_36::HttpEntityBodyWriter::~HttpEntityBodyWriter(HttpEntityBodyWriter *this)

{
  String local_48;
  bool local_2d;
  bool _kj_shouldLog;
  HttpOutputStream *local_20;
  HttpOutputStream *inner;
  HttpOutputStream *_inner2400;
  HttpEntityBodyWriter *this_local;
  
  (this->super_AsyncOutputStream)._vptr_AsyncOutputStream =
       (_func_int **)&PTR___cxa_pure_virtual_00c07890;
  _inner2400 = (HttpOutputStream *)this;
  if ((this->finished & 1U) == 0) {
    inner = kj::_::readMaybe<kj::(anonymous_namespace)::HttpOutputStream>(&this->weakInner);
    if (inner == (HttpOutputStream *)0x0) {
      local_2d = kj::_::Debug::shouldLog(ERROR);
      while (local_2d != false) {
        getStackTrace();
        kj::_::Debug::log<char_const(&)[55],kj::String>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x966,ERROR,
                   "\"HTTP body output stream outlived underlying connection\", kj::getStackTrace()"
                   ,(char (*) [55])"HTTP body output stream outlived underlying connection",
                   &local_48);
        String::~String(&local_48);
        local_2d = false;
      }
    }
    else {
      local_20 = inner;
      WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>::unsetCurrentWrapper
                (&inner->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>,
                 &this->weakInner);
      HttpOutputStream::abortBody(local_20);
    }
  }
  AsyncOutputStream::~AsyncOutputStream(&this->super_AsyncOutputStream);
  return;
}

Assistant:

~HttpEntityBodyWriter() noexcept(false) {
    if (!finished) {
      KJ_IF_SOME(inner, weakInner) {
        inner.unsetCurrentWrapper(weakInner);
        inner.abortBody();
      } else {
        // Since we're in a destructor, log an error instead of throwing.
        KJ_LOG(ERROR, "HTTP body output stream outlived underlying connection",
            kj::getStackTrace());
      }
    }